

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTcNamedArgTab::generate(CTcNamedArgTab *this)

{
  ulong ofs;
  ulong uVar1;
  size_t in_RCX;
  int iVar2;
  CTPNArg *pCVar3;
  ulong ofs_00;
  
  CTcPrsNode::def_label_pos(this->lbl);
  CTcGenTarg::write_op(G_cg,'W');
  ofs = (G_cs->super_CTcDataStream).ofs_;
  CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
  CTcDataStream::write2(&G_cs->super_CTcDataStream,this->cnt);
  uVar1 = (G_cs->super_CTcDataStream).ofs_;
  pCVar3 = (CTPNArg *)this->arglist;
  while (pCVar3 = (pCVar3->super_CTPNArgBase).next_arg_, pCVar3 != (CTPNArg *)0x0) {
    if ((pCVar3->super_CTPNArgBase).name_.typ_ != TOKT_INVALID) {
      CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
    }
  }
  CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
  pCVar3 = (CTPNArg *)this->arglist;
  ofs_00 = uVar1;
  while( true ) {
    pCVar3 = (pCVar3->super_CTPNArgBase).next_arg_;
    iVar2 = (int)uVar1;
    if (pCVar3 == (CTPNArg *)0x0) break;
    if ((pCVar3->super_CTPNArgBase).name_.typ_ != TOKT_INVALID) {
      CTcDataStream::write2_at
                (&G_cs->super_CTcDataStream,ofs_00,(int)(G_cs->super_CTcDataStream).ofs_ - iVar2);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(pCVar3->super_CTPNArgBase).name_.text_,
                 (void *)(pCVar3->super_CTPNArgBase).name_.text_len_,in_RCX);
      ofs_00 = ofs_00 + 2;
    }
  }
  CTcDataStream::write2_at
            (&G_cs->super_CTcDataStream,ofs_00,(int)(G_cs->super_CTcDataStream).ofs_ - iVar2);
  CTcDataStream::write2_at
            (&G_cs->super_CTcDataStream,ofs,((int)(G_cs->super_CTcDataStream).ofs_ - (int)ofs) - 2);
  return;
}

Assistant:

void generate()
    {
        /* define the label location and start the table */
        CTcPrsNode::def_label_pos(lbl);
        G_cg->write_op(OPC_NAMEDARGTAB);

        /* write a placeholder for the table size */
        ulong start = G_cs->get_ofs();
        G_cs->write2(0);

        /* write the number of arguments in the list */
        G_cs->write2(cnt);

        /* write placeholders for the index entries */
        ulong idx = G_cs->get_ofs(), idx0 = idx;
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write an index placeholder */
            if (arg->is_named_param())
                G_cs->write2(0);
        }

        /* write a final index marker, for computing the last item's length */
        G_cs->write2(0);

        /* write the strings */
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write it out */
            if (arg->is_named_param())
            {
                /* write its index pointer */
                G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

                /* write the string */
                G_cs->write(arg->get_name(), arg->get_name_len());

                /* advance the index pointer */
                idx += 2;
            }
        }

        /* write the final index marker */
        G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

        /* go back and fill in the table length prefix */
        G_cs->write2_at(start, G_cs->get_ofs() - start - 2);
    }